

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

void __thiscall google::protobuf::MessageLite::DeleteInstance(MessageLite *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (*this->_vptr_MessageLite[4])();
  uVar1 = *(uint *)(CONCAT44(extraout_var,iVar2) + 0x28);
  (**this->_vptr_MessageLite)(this);
  operator_delete(this,(ulong)uVar1);
  return;
}

Assistant:

void MessageLite::DeleteInstance() {
  // Cache the size and pointer because we can't access them after the
  // destruction.
  const size_t size = GetClassData()->allocation_size();
  void* const ptr = this;
  DestroyInstance();
  internal::SizedDelete(ptr, size);
}